

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

string * GetNonDefaultString<unsigned_int>(string *__return_storage_ptr__,char *name,uint *value)

{
  uint *puVar1;
  size_t sVar2;
  ostream *poVar3;
  string *psVar4;
  ostringstream ss;
  long local_198 [3];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Control ",8);
  if (name == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,name,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198," is set to non-default value: ",0x1e);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  psVar4 = (string *)std::ios_base::~ios_base(local_128);
  return psVar4;
}

Assistant:

static std::string GetNonDefaultString(
    const char* name,
    const T& value )
{
    std::ostringstream ss;
    ss << std::boolalpha;
    ss << "Control " << name << " is set to non-default value: " << value << "\n";
    return ss.str();
}